

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

_Bool conn_maxage(Curl_easy *data,connectdata *conn,curltime now)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [12];
  timediff_t tVar6;
  curltime older;
  curltime older_00;
  curltime newer;
  curltime newer_00;
  timediff_t lifetime;
  timediff_t idletime;
  connectdata *conn_local;
  Curl_easy *data_local;
  curltime now_local;
  
  auVar5 = now._0_12_;
  uVar1 = (conn->lastused).tv_sec;
  uVar2 = (conn->lastused).tv_usec;
  older.tv_usec = uVar2;
  older.tv_sec = uVar1;
  older._12_4_ = 0;
  newer._12_4_ = 0;
  newer.tv_sec = auVar5._0_8_;
  newer.tv_usec = auVar5._8_4_;
  tVar6 = Curl_timediff(newer,older);
  if ((data->set).maxage_conn < tVar6 / 1000) {
    Curl_infof(data,"Too old connection (%ld seconds idle), disconnect it",tVar6 / 1000);
    now_local._15_1_ = 1;
  }
  else {
    uVar3 = (conn->created).tv_sec;
    uVar4 = (conn->created).tv_usec;
    older_00.tv_usec = uVar4;
    older_00.tv_sec = uVar3;
    older_00._12_4_ = 0;
    newer_00._12_4_ = 0;
    newer_00.tv_sec = auVar5._0_8_;
    newer_00.tv_usec = auVar5._8_4_;
    tVar6 = Curl_timediff(newer_00,older_00);
    if (((data->set).maxlifetime_conn == 0) || (tVar6 / 1000 <= (data->set).maxlifetime_conn)) {
      now_local._15_1_ = 0;
    }
    else {
      Curl_infof(data,"Too old connection (%ld seconds since creation), disconnect it",tVar6 / 1000)
      ;
      now_local._15_1_ = 1;
    }
  }
  return (_Bool)now_local._15_1_;
}

Assistant:

static bool conn_maxage(struct Curl_easy *data,
                        struct connectdata *conn,
                        struct curltime now)
{
  timediff_t idletime, lifetime;

  idletime = Curl_timediff(now, conn->lastused);
  idletime /= 1000; /* integer seconds is fine */

  if(idletime > data->set.maxage_conn) {
    infof(data, "Too old connection (%ld seconds idle), disconnect it",
          idletime);
    return TRUE;
  }

  lifetime = Curl_timediff(now, conn->created);
  lifetime /= 1000; /* integer seconds is fine */

  if(data->set.maxlifetime_conn && lifetime > data->set.maxlifetime_conn) {
    infof(data,
          "Too old connection (%ld seconds since creation), disconnect it",
          lifetime);
    return TRUE;
  }


  return FALSE;
}